

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall
Plan::AddSubTarget(Plan *this,Node *node,Node *dependent,string *err,
                  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *dyndep_walk)

{
  bool bVar1;
  iterator want_e;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  pointer ppNVar5;
  bool bVar6;
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>,_bool> pVar7;
  Edge *edge;
  string referenced;
  Edge *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  pair<Edge_*,_Plan::Want> local_90;
  undefined1 local_80 [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_d8 = node->in_edge_;
  if (local_d8 == (Edge *)0x0) {
    if (node->dirty_ == true) {
      local_90.second = kWantNothing;
      local_90._12_4_ = 0;
      local_80[0] = 0;
      local_90.first = (Edge *)local_80;
      if (dependent != (Node *)0x0) {
        std::operator+(&local_d0,", needed by \'",&dependent->path_);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_a0 = *plVar3;
          lStack_98 = plVar2[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar3;
          local_b0 = (long *)*plVar2;
        }
        local_a8 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_80 + 0x30),"\'",&node->path_);
      plVar2 = (long *)std::__cxx11::string::append(local_80 + 0x30);
      ppNVar5 = (pointer)(plVar2 + 2);
      if ((pointer)*plVar2 == ppNVar5) {
        local_80._32_8_ = *ppNVar5;
        local_80._40_8_ = plVar2[3];
        local_80._16_8_ = local_80 + 0x20;
      }
      else {
        local_80._32_8_ = *ppNVar5;
        local_80._16_8_ = (pointer)*plVar2;
      }
      local_80._24_8_ = plVar2[1];
      *plVar2 = (long)ppNVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append(local_80 + 0x10,(ulong)local_90.first);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_d0.field_2._M_allocated_capacity = *psVar4;
        local_d0.field_2._8_8_ = plVar2[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar4;
        local_d0._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_d0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_a0 = *plVar3;
        lStack_98 = plVar2[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar3;
        local_b0 = (long *)*plVar2;
      }
      local_a8 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::operator=((string *)err,(string *)&local_b0);
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_80._16_8_ != local_80 + 0x20) {
        operator_delete((void *)local_80._16_8_,
                        (ulong)((long)&(((string *)local_80._32_8_)->_M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._48_8_ != &local_40) {
        operator_delete((void *)local_80._48_8_,local_40._M_allocated_capacity + 1);
      }
      if (local_90.first != (Edge *)local_80) {
        operator_delete(local_90.first,CONCAT71(local_80._1_7_,local_80[0]) + 1);
      }
    }
    return false;
  }
  if (local_d8->outputs_ready_ != false) {
    return false;
  }
  local_90._8_8_ = local_90._8_8_ & 0xffffffff00000000;
  local_90.first = local_d8;
  pVar7 = std::
          _Rb_tree<Edge*,std::pair<Edge*const,Plan::Want>,std::_Select1st<std::pair<Edge*const,Plan::Want>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
          ::_M_emplace_unique<std::pair<Edge*,Plan::Want>>
                    ((_Rb_tree<Edge*,std::pair<Edge*const,Plan::Want>,std::_Select1st<std::pair<Edge*const,Plan::Want>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
                      *)this,&local_90);
  want_e._M_node = (_Base_ptr)pVar7.first._M_node;
  if ((dyndep_walk != (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0) &&
     (*(int *)&want_e._M_node[1]._M_parent == 2)) {
    return false;
  }
  if ((node->dirty_ == true) && (*(int *)&want_e._M_node[1]._M_parent == 0)) {
    *(undefined4 *)&want_e._M_node[1]._M_parent = 1;
    this->wanted_edges_ = this->wanted_edges_ + 1;
    bVar6 = Edge::is_phony(local_d8);
    if (!bVar6) {
      this->command_edges_ = this->command_edges_ + 1;
    }
    if (dyndep_walk == (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0) {
      bVar6 = Edge::AllInputsReady(local_d8);
      if (bVar6) {
        ScheduleWork(this,want_e);
      }
      goto LAB_00191875;
    }
  }
  else {
LAB_00191875:
    if (dyndep_walk == (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0)
    goto LAB_00191885;
  }
  std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>::
  _M_insert_unique<Edge*const&>
            ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>> *)
             dyndep_walk,&local_d8);
LAB_00191885:
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    return true;
  }
  ppNVar5 = (local_d8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    bVar6 = ppNVar5 ==
            (local_d8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar6) {
      return bVar6;
    }
    bVar1 = AddSubTarget(this,*ppNVar5,node,err,dyndep_walk);
    if ((!bVar1) && (err->_M_string_length != 0)) break;
    ppNVar5 = ppNVar5 + 1;
  }
  return bVar6;
}

Assistant:

bool Plan::AddSubTarget(const Node* node, const Node* dependent, string* err,
                        set<Edge*>* dyndep_walk) {
  Edge* edge = node->in_edge();
  if (!edge) {  // Leaf node.
    if (node->dirty()) {
      string referenced;
      if (dependent)
        referenced = ", needed by '" + dependent->path() + "',";
      *err = "'" + node->path() + "'" + referenced + " missing "
             "and no known rule to make it";
    }
    return false;
  }

  if (edge->outputs_ready())
    return false;  // Don't need to do anything.

  // If an entry in want_ does not already exist for edge, create an entry which
  // maps to kWantNothing, indicating that we do not want to build this entry itself.
  pair<map<Edge*, Want>::iterator, bool> want_ins =
    want_.insert(make_pair(edge, kWantNothing));
  Want& want = want_ins.first->second;

  if (dyndep_walk && want == kWantToFinish)
    return false;  // Don't need to do anything with already-scheduled edge.

  // If we do need to build edge and we haven't already marked it as wanted,
  // mark it now.
  if (node->dirty() && want == kWantNothing) {
    want = kWantToStart;
    EdgeWanted(edge);
    if (!dyndep_walk && edge->AllInputsReady())
      ScheduleWork(want_ins.first);
  }

  if (dyndep_walk)
    dyndep_walk->insert(edge);

  if (!want_ins.second)
    return true;  // We've already processed the inputs.

  for (vector<Node*>::iterator i = edge->inputs_.begin();
       i != edge->inputs_.end(); ++i) {
    if (!AddSubTarget(*i, node, err, dyndep_walk) && !err->empty())
      return false;
  }

  return true;
}